

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

Type __thiscall
wasm::anon_unknown_24::HeapTypeGeneratorImpl::generateTupleType
          (HeapTypeGeneratorImpl *this,Shareability share)

{
  vector *pvVar1;
  bool bVar2;
  uint32_t uVar3;
  uintptr_t uVar4;
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_90;
  uintptr_t local_78;
  reference local_70;
  Type *type;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Type,_std::allocator<wasm::Type>_> *__range2;
  allocator<wasm::Type> local_39;
  undefined1 local_38 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> types;
  Shareability share_local;
  HeapTypeGeneratorImpl *this_local;
  
  types.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = share;
  uVar3 = Random::upTo(this->rand,(this->params).MAX_TUPLE_SIZE - 1);
  std::allocator<wasm::Type>::allocator(&local_39);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38,(ulong)(uVar3 + 2),
             &local_39);
  std::allocator<wasm::Type>::~allocator(&local_39);
  __end2 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin
                     ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38);
  type = (Type *)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::end
                           ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
                                *)&type);
    if (!bVar2) break;
    local_70 = __gnu_cxx::
               __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
               ::operator*(&__end2);
    local_78 = (uintptr_t)
               generateSingleType(this,types.
                                       super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    local_70->id = local_78;
    __gnu_cxx::
    __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>::
    operator++(&__end2);
  }
  pvVar1 = (vector *)this->builder;
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            (&local_90,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38);
  uVar4 = ::wasm::TypeBuilder::getTempTupleType(pvVar1);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector(&local_90);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_38);
  return (Type)uVar4;
}

Assistant:

Type generateTupleType(Shareability share) {
    std::vector<Type> types(2 + rand.upTo(params.MAX_TUPLE_SIZE - 1));
    for (auto& type : types) {
      type = generateSingleType(share);
    }
    return builder.getTempTupleType(Tuple(types));
  }